

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::RootRelease(Recycler *this,void *obj,uint *count)

{
  undefined4 *puVar1;
  StackBackTraceNode *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  EntryType *pEVar7;
  PinRecord *head;
  StackBackTrace *pSVar8;
  StackBackTraceNode *pSVar9;
  undefined8 *in_FS_OFFSET;
  
  BVar5 = IsValidObject(this,obj,0);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x269,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar4) goto LAB_00267caa;
    *puVar1 = 0;
  }
  if (this->transientPinnedObject == obj) {
    this->transientPinnedObject = (void *)0x0;
    if (count != (uint *)0x0) {
      pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
               ::FindEntry(&this->pinnedObjectMap,obj);
      if (pEVar7 == (EntryType *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (pEVar7->value).refCount;
      }
      *count = uVar6;
    }
    if (this->recyclerFlagsTable->LeakStackTrace == true) {
      DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
                ((AllocatorType *)&NoCheckHeapAllocator::Instance,
                 this->transientPinnedObjectStackBackTrace,
                 (ulong)this->transientPinnedObjectStackBackTrace->requestedFramesToCapture << 3);
    }
LAB_00267c94:
    CollectNow<(Memory::CollectionFlags)8320>(this);
    return;
  }
  pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
           ::FindEntry(&this->pinnedObjectMap,obj);
  head = &pEVar7->value;
  if (pEVar7 == (EntryType *)0x0) {
    if (count != (uint *)0x0) {
      *count = 0xffffffff;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x288,"(false)","false");
    if (!bVar4) {
LAB_00267caa:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  else {
    uVar6 = (pEVar7->value).refCount - 1;
    (pEVar7->value).refCount = uVar6;
    if (count != (uint *)0x0) {
      *count = uVar6;
    }
    if (uVar6 == 0) {
      StackBackTraceNode::DeleteAll<Memory::NoCheckHeapAllocator>
                ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&head->stackBackTraces);
      head->stackBackTraces = (StackBackTraceNode *)0x0;
      if (this->hasPendingConcurrentFindRoot == true) {
        this->hasPendingUnpinnedObject = true;
      }
      else {
        SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
        ::Remove(&this->pinnedObjectMap,obj,(PinRecord *)0x0);
      }
      goto LAB_00267c94;
    }
    if (this->recyclerFlagsTable->LeakStackTrace == true) {
      pSVar8 = StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
      pSVar9 = (StackBackTraceNode *)
               NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x10);
      pSVar2 = head->stackBackTraces;
      pSVar9->stackBackTrace = pSVar8;
      pSVar9->next = pSVar2;
      head->stackBackTraces = pSVar9;
    }
  }
  return;
}

Assistant:

void
Recycler::RootRelease(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject == obj)
    {
        transientPinnedObject = nullptr;

        if (count != nullptr)
        {
            PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
            *count = (refCount != nullptr) ? *refCount : 0;
        }

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            transientPinnedObjectStackBackTrace->Delete(&NoCheckHeapAllocator::Instance);
        }
#endif
#endif
    }
    else
    {
        PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
        if (refCount == nullptr)
        {
            if (count != nullptr)
            {
                *count = (uint)-1;
            }
            // REVIEW: throw if not found
            Assert(false);
            return;
        }

        uint newRefCount = (--(*refCount));

        if (count != nullptr)
        {
            *count = newRefCount;
        }

        if (newRefCount != 0)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces,
                    StackBackTrace::Capture(&NoCheckHeapAllocator::Instance));
            }
#endif
#endif
            return;
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        StackBackTraceNode::DeleteAll(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces);
        refCount->stackBackTraces = nullptr;
#endif
#endif
#if ENABLE_CONCURRENT_GC
        // Don't delete the entry if we are in concurrent find root state
        // We will delete it later on in-thread find root
        if (this->hasPendingConcurrentFindRoot)
        {
            this->hasPendingUnpinnedObject = true;
        }
        else
#endif
        {
            pinnedObjectMap.Remove(obj);
        }

        RECYCLER_PERF_COUNTER_DEC(PinnedObject);
    }

    // Any time a root is removed during a GC, it indicates that an exhaustive
    // collection is likely going to have work to do so trigger an exhaustive
    // candidate GC to indicate this fact
    this->CollectNow<CollectExhaustiveCandidate>();
}